

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::BaseRenderingCase::drawPrimitives
          (BaseRenderingCase *this,Surface *result,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colorData,
          GLenum primitiveType)

{
  RenderContext *context;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  deUint32 err;
  undefined4 extraout_var;
  void *data;
  TextureFormat local_60;
  PixelBufferAccess local_58;
  long lVar5;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar5 + 0x780))((this->m_shader->m_program).m_program,"a_position");
  uVar3 = (**(code **)(lVar5 + 0x780))((this->m_shader->m_program).m_program,"a_color");
  uVar4 = (**(code **)(lVar5 + 0xb48))((this->m_shader->m_program).m_program,"u_pointSize");
  (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar5 + 0x188))(0x4000);
  (**(code **)(lVar5 + 0x1a00))(0,0,this->m_renderSize);
  (**(code **)(lVar5 + 0x1680))((this->m_shader->m_program).m_program);
  (**(code **)(lVar5 + 0x610))(uVar2);
  (**(code **)(lVar5 + 0x19f0))
            (uVar2,4,0x1406,0,0,
             (vertexData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar5 + 0x610))(uVar3);
  (**(code **)(lVar5 + 0x19f0))
            (uVar3,4,0x1406,0,0,
             (colorData->
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar5 + 0x14e0))(this->m_pointSize,uVar4);
  (**(code **)(lVar5 + 0xce0))(this->m_lineWidth);
  (**(code **)(lVar5 + 0x538))
            (primitiveType,0,
             (ulong)((long)(vertexData->
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(vertexData->
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 4);
  (**(code **)(lVar5 + 0x518))(uVar3);
  (**(code **)(lVar5 + 0x518))(uVar2);
  (**(code **)(lVar5 + 0x1680))(0);
  (**(code **)(lVar5 + 0x648))();
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"draw primitives",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fRasterizationTests.cpp"
                  ,0xd8);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_60.order = RGBA;
  local_60.type = UNORM_INT8;
  data = (void *)(result->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (result->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_58,&local_60,result->m_width,result->m_height,1,data);
  glu::readPixels(context,0,0,&local_58);
  return;
}

Assistant:

void BaseRenderingCase::drawPrimitives (tcu::Surface& result, const std::vector<tcu::Vec4>& vertexData, const std::vector<tcu::Vec4>& colorData, glw::GLenum primitiveType)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const glw::GLint		positionLoc		= gl.getAttribLocation(m_shader->getProgram(), "a_position");
	const glw::GLint		colorLoc		= gl.getAttribLocation(m_shader->getProgram(), "a_color");
	const glw::GLint		pointSizeLoc	= gl.getUniformLocation(m_shader->getProgram(), "u_pointSize");

	gl.clearColor					(0, 0, 0, 1);
	gl.clear						(GL_COLOR_BUFFER_BIT);
	gl.viewport						(0, 0, m_renderSize, m_renderSize);
	gl.useProgram					(m_shader->getProgram());
	gl.enableVertexAttribArray		(positionLoc);
	gl.vertexAttribPointer			(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &vertexData[0]);
	gl.enableVertexAttribArray		(colorLoc);
	gl.vertexAttribPointer			(colorLoc, 4, GL_FLOAT, GL_FALSE, 0, &colorData[0]);
	gl.uniform1f					(pointSizeLoc, m_pointSize);
	gl.lineWidth					(m_lineWidth);
	gl.drawArrays					(primitiveType, 0, (glw::GLsizei)vertexData.size());
	gl.disableVertexAttribArray		(colorLoc);
	gl.disableVertexAttribArray		(positionLoc);
	gl.useProgram					(0);
	gl.finish						();
	GLU_EXPECT_NO_ERROR				(gl.getError(), "draw primitives");

	glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
}